

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

optional<long> slang::parseInt<long>(string_view name,string_view value,string *error)

{
  _Storage<long,_true> extraout_RAX;
  char *__first;
  size_t sVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *this;
  string *psVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string *__return_storage_ptr__;
  string_view fmt;
  format_args args;
  __integer_from_chars_result_type<long> _Var6;
  optional<long> oVar7;
  long val;
  string local_78;
  string local_58;
  
  __first = value._M_str;
  sVar2 = value._M_len;
  if (sVar2 == 0) {
    psVar5 = &local_78;
    this = "expected value for argument \'{}\'";
    __return_storage_ptr__ = &local_58;
    pcVar4 = (char *)0x20;
    sVar1 = 0xd;
    local_78._M_dataplus._M_p = name._M_str;
    local_78._M_string_length = name._M_len;
  }
  else {
    _Var6 = std::from_chars<long>(__first,__first + sVar2,&val,10);
    if (_Var6.ec == 0 && _Var6.ptr == __first + sVar2) {
      uVar3 = CONCAT71(_Var6._9_7_,1);
      goto LAB_001a1042;
    }
    psVar5 = &local_58;
    this = "invalid value \'{}\' for integer argument \'{}\'";
    __return_storage_ptr__ = &local_78;
    pcVar4 = (char *)0x2c;
    sVar1 = 0xdd;
    local_58._M_dataplus._M_p = __first;
    local_58._M_string_length = sVar2;
    local_58.field_2._M_allocated_capacity = (size_type)name._M_str;
    local_58.field_2._8_8_ = name._M_len;
  }
  fmt.size_ = sVar1;
  fmt.data_ = pcVar4;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)psVar5;
  ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)this,fmt,args);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (error,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  uVar3 = 0;
  val = extraout_RAX._M_value;
LAB_001a1042:
  oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar3;
  oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = val;
  return (optional<long>)
         oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

static std::optional<T> parseInt(std::string_view name, std::string_view value,
                                 std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}